

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O2

void __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::CopyGeometryDescriptionUnsafe
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,BottomLevelASDesc *SrcDesc,
          BLASNameToIndex *pSrcNameToIndex)

{
  uint8_t *puVar1;
  FixedLinearAllocator MemPool;
  FixedLinearAllocator local_68;
  
  local_68.m_pAllocator = GetRawAllocator();
  local_68.m_pDataStart = (uint8_t *)0x0;
  local_68.m_pCurrPtr = (uint8_t *)0x0;
  local_68.m_ReservedSize = 0;
  local_68.m_CurrAlignment = 0;
  local_68.m_DbgCurrAllocation = 0;
  local_68.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.m_DbgUsingExternalMemory = false;
  CopyBLASGeometryDesc
            (SrcDesc,&(this->
                      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                      ).m_Desc,&local_68,pSrcNameToIndex,&this->m_NameToIndex);
  puVar1 = local_68.m_pDataStart;
  local_68.m_ReservedSize = 0;
  local_68.m_CurrAlignment = 0;
  local_68.m_pAllocator = (IMemoryAllocator *)0x0;
  local_68.m_DbgCurrAllocation = 0;
  local_68.m_pDataStart = (uint8_t *)0x0;
  local_68.m_pCurrPtr = (uint8_t *)0x0;
  if (local_68.m_DbgAllocations.
      super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_68.m_DbgAllocations.
      super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_68.m_DbgAllocations.
    super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.m_DbgAllocations.
         super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_68.m_DbgUsingExternalMemory = false;
  this->m_pRawPtr = puVar1;
  FixedLinearAllocator::~FixedLinearAllocator(&local_68);
  return;
}

Assistant:

void CopyGeometryDescriptionUnsafe(const BottomLevelASDesc& SrcDesc, const BLASNameToIndex* pSrcNameToIndex) noexcept(false)
    {
        FixedLinearAllocator MemPool{GetRawAllocator()};
        CopyBLASGeometryDesc(SrcDesc, this->m_Desc, MemPool, pSrcNameToIndex, this->m_NameToIndex);
        this->m_pRawPtr = MemPool.Release();
    }